

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O0

int mz_uncompress(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len)

{
  int local_a8;
  undefined1 auStack_a0 [4];
  int status;
  mz_stream stream;
  mz_ulong source_len_local;
  uchar *pSource_local;
  mz_ulong *pDest_len_local;
  uchar *pDest_local;
  
  stream.reserved = source_len;
  memset(auStack_a0,0,0x70);
  if ((stream.reserved | *pDest_len) < 0x100000000) {
    stream.next_in._0_4_ = (int)stream.reserved;
    stream.next_out._0_4_ = (undefined4)*pDest_len;
    _auStack_a0 = pSource;
    stream.total_in = (mz_ulong)pDest;
    pDest_local._4_4_ = mz_inflateInit((mz_streamp)auStack_a0);
    if (pDest_local._4_4_ == 0) {
      local_a8 = mz_inflate((mz_streamp)auStack_a0,4);
      if (local_a8 == 1) {
        *pDest_len = stream._32_8_;
        pDest_local._4_4_ = mz_inflateEnd((mz_streamp)auStack_a0);
      }
      else {
        mz_inflateEnd((mz_streamp)auStack_a0);
        if ((local_a8 == -5) && ((int)stream.next_in == 0)) {
          local_a8 = -3;
        }
        pDest_local._4_4_ = local_a8;
      }
    }
  }
  else {
    pDest_local._4_4_ = -10000;
  }
  return pDest_local._4_4_;
}

Assistant:

int mz_uncompress(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource,
    mz_ulong source_len)
{
    mz_stream stream;
    int status;
    memset(&stream, 0, sizeof(stream));

    // In case mz_ulong is 64-bits (argh I hate longs).
    if ((source_len | *pDest_len) > 0xFFFFFFFFU)
        return MZ_PARAM_ERROR;

    stream.next_in = pSource;
    stream.avail_in = (mz_uint32)source_len;
    stream.next_out = pDest;
    stream.avail_out = (mz_uint32) * pDest_len;

    status = mz_inflateInit(&stream);
    if (status != MZ_OK)
        return status;

    status = mz_inflate(&stream, MZ_FINISH);
    if (status != MZ_STREAM_END)
    {
        mz_inflateEnd(&stream);
        return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR : status;
    }
    *pDest_len = stream.total_out;

    return mz_inflateEnd(&stream);
}